

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O1

void stressing_single_thread(void)

{
  int v;
  Logger local_ff8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------stressing test single thread-----------",0x31);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  v = 0;
  do {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/tests/LoggingTest.cpp"
                   ,0x2d);
    LogStream::operator<<((LogStream *)&local_ff8,v);
    Logger::~Logger(&local_ff8);
    v = v + 1;
  } while (v != 100000);
  return;
}

Assistant:

void stressing_single_thread()
{
    // 100000 lines
    cout << "----------stressing test single thread-----------" << endl;
    for (int i = 0; i < 100000; ++i)
    {
        LOG << i;
    }
}